

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_minimum_duration.cpp
# Opt level: O3

int main(void)

{
  pointer __src;
  Result RVar1;
  ostream *poVar2;
  size_t i;
  long lVar3;
  OutputParameter<3UL,_ruckig::StandardVector> output;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  long *local_1ef0;
  long local_1ee8;
  long local_1ee0 [2];
  OutputParameter<3UL,_ruckig::StandardVector> local_1ed0;
  InputParameter<3UL,_ruckig::StandardVector> local_1d88;
  ostringstream local_1ab8 [112];
  ios_base local_1a48 [264];
  undefined1 local_1940 [6416];
  
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1940,0.01);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>(&local_1d88);
  local_1ed0.degrees_of_freedom = 3;
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::Trajectory<3UL,_0>(&local_1ed0.trajectory);
  local_1ed0.time = 0.0;
  local_1ed0.new_section._0_7_ = 0;
  local_1ed0.new_section._7_1_ = 0;
  local_1ed0.did_section_change = false;
  local_1ed0.new_calculation = false;
  local_1ed0.was_calculation_interrupted = false;
  local_1d88.current_position._M_elems[0] = 0.0;
  local_1d88.current_position._M_elems[1] = 0.0;
  local_1d88.current_position._M_elems[2] = 0.5;
  local_1d88.current_velocity._M_elems[0] = 0.0;
  local_1d88.current_velocity._M_elems[1] = -2.2;
  local_1d88.current_velocity._M_elems[2] = -0.5;
  local_1d88.current_acceleration._M_elems[0] = 0.0;
  local_1d88.current_acceleration._M_elems[1] = 2.5;
  local_1d88.current_acceleration._M_elems[2] = -0.5;
  local_1d88.target_position._M_elems[0] = -5.0;
  local_1d88.target_position._M_elems[1] = -2.0;
  local_1d88.target_position._M_elems[2] = -3.5;
  local_1d88.target_velocity._M_elems[0] = 0.0;
  local_1d88.target_velocity._M_elems[1] = -0.5;
  local_1d88.target_velocity._M_elems[2] = -2.0;
  local_1d88.target_acceleration._M_elems[2] = 0.5;
  local_1d88.target_acceleration._M_elems[0] = 0.0;
  local_1d88.target_acceleration._M_elems[1] = 0.0;
  local_1d88.max_velocity._M_elems[2] = 3.0;
  local_1d88.max_velocity._M_elems[0] = 3.0;
  local_1d88.max_velocity._M_elems[1] = 1.0;
  local_1d88.max_acceleration._M_elems[2] = 1.0;
  local_1d88.max_acceleration._M_elems[0] = 3.0;
  local_1d88.max_acceleration._M_elems[1] = 2.0;
  local_1d88.max_jerk._M_elems[2] = 2.0;
  local_1d88.max_jerk._M_elems[0] = 4.0;
  local_1d88.max_jerk._M_elems[1] = 3.0;
  local_1d88.minimum_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload._M_value = 5.0;
  local_1d88.minimum_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t | position",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  while( true ) {
    RVar1 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
                      ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1940,&local_1d88,
                       &local_1ed0);
    if (RVar1 != Working) break;
    poVar2 = std::ostream::_M_insert<double>(local_1ed0.time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," | ",3);
    std::__cxx11::ostringstream::ostringstream(local_1ab8);
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1ab8,", ",2);
      }
      std::ostream::_M_insert<double>(local_1ed0.new_position._M_elems[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1ab8);
    std::ios_base::~ios_base(local_1a48);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_1ef0,local_1ee8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1ef0 != local_1ee0) {
      operator_delete(local_1ef0,local_1ee0[0] + 1);
    }
    local_1d88.current_position._M_elems[2] = local_1ed0.new_position._M_elems[2];
    local_1d88.current_position._M_elems[0] = local_1ed0.new_position._M_elems[0];
    local_1d88.current_position._M_elems[1] = local_1ed0.new_position._M_elems[1];
    local_1d88.current_velocity._M_elems[2] = local_1ed0.new_velocity._M_elems[2];
    local_1d88.current_velocity._M_elems[0] = local_1ed0.new_velocity._M_elems[0];
    local_1d88.current_velocity._M_elems[1] = local_1ed0.new_velocity._M_elems[1];
    local_1d88.current_acceleration._M_elems[2] = local_1ed0.new_acceleration._M_elems[2];
    local_1d88.current_acceleration._M_elems[0] = local_1ed0.new_acceleration._M_elems[0];
    local_1d88.current_acceleration._M_elems[1] = local_1ed0.new_acceleration._M_elems[1];
    if (local_1ed0.did_section_change == true) {
      if (local_1d88.intermediate_positions.
          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_1d88.intermediate_positions.
          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        __src = local_1d88.intermediate_positions.
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
        if (__src != local_1d88.intermediate_positions.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
          memmove(local_1d88.intermediate_positions.
                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,__src,
                  (long)local_1d88.intermediate_positions.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
        }
        local_1d88.intermediate_positions.
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1d88.intermediate_positions.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Trajectory duration: ",0x15);
  poVar2 = std::ostream::_M_insert<double>(local_1ed0.trajectory.duration);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," [s].",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1ed0.trajectory.cumulative_times.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ed0.trajectory.cumulative_times.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1ed0.trajectory.cumulative_times.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1ed0.trajectory.cumulative_times.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1ed0.trajectory.profiles.
      super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ed0.trajectory.profiles.
                    super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1ed0.trajectory.profiles.
                          super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1ed0.trajectory.profiles.
                          super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter(&local_1d88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1940._6376_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1940._6376_8_);
  }
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1940);
  return 0;
}

Assistant:

int main() {
    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<3> otg(0.01);  // control cycle
    InputParameter<3> input;
    OutputParameter<3> output;

    // Set input parameters
    input.current_position = {0.0, 0.0, 0.5};
    input.current_velocity = {0.0, -2.2, -0.5};
    input.current_acceleration = {0.0, 2.5, -0.5};

    input.target_position = {-5.0, -2.0, -3.5};
    input.target_velocity = {0.0, -0.5, -2.0};
    input.target_acceleration = {0.0, 0.0, 0.5};

    input.max_velocity = {3.0, 1.0, 3.0};
    input.max_acceleration = {3.0, 2.0, 1.0};
    input.max_jerk = {4.0, 3.0, 2.0};

    // Set minimum duration (equals the trajectory duration when target velocity and acceleration are zero)
    input.minimum_duration = 5.0;

    // Generate the trajectory within the control loop
    std::cout << "t | position" << std::endl;
    while (otg.update(input, output) == Result::Working) {
        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);
    }

    std::cout << "Trajectory duration: " << output.trajectory.get_duration() << " [s]." << std::endl;
}